

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddInputCharactersUTF8(ImGuiIO *this,char *utf8_chars)

{
  int *piVar1;
  char cVar2;
  unsigned_short *puVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong in_RAX;
  unsigned_short *__dest;
  int iVar8;
  uint c;
  undefined8 uStack_38;
  
  cVar2 = *utf8_chars;
  while (cVar2 != '\0') {
    uStack_38 = in_RAX & 0xffffffff;
    iVar6 = ImTextCharFromUtf8((uint *)((long)&uStack_38 + 4),utf8_chars,(char *)0x0);
    uVar5 = uStack_38;
    if (uStack_38._4_4_ != 0) {
      iVar8 = (this->InputQueueCharacters).Size;
      if (iVar8 == (this->InputQueueCharacters).Capacity) {
        if (iVar8 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar8 / 2 + iVar8;
        }
        iVar4 = iVar8 + 1;
        if (iVar8 + 1 < iVar7) {
          iVar4 = iVar7;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (unsigned_short *)(*GImAllocatorAllocFunc)((long)iVar4 * 2,GImAllocatorUserData);
        puVar3 = (this->InputQueueCharacters).Data;
        if (puVar3 != (unsigned_short *)0x0) {
          memcpy(__dest,puVar3,(long)(this->InputQueueCharacters).Size * 2);
          puVar3 = (this->InputQueueCharacters).Data;
          if ((puVar3 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(puVar3,GImAllocatorUserData);
        }
        (this->InputQueueCharacters).Data = __dest;
        (this->InputQueueCharacters).Capacity = iVar4;
        iVar8 = (this->InputQueueCharacters).Size;
      }
      else {
        __dest = (this->InputQueueCharacters).Data;
      }
      __dest[iVar8] = (unsigned_short)(uVar5 >> 0x20);
      (this->InputQueueCharacters).Size = (this->InputQueueCharacters).Size + 1;
    }
    utf8_chars = utf8_chars + iVar6;
    in_RAX = uStack_38;
    cVar2 = *utf8_chars;
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharactersUTF8(const char* utf8_chars)
{
    while (*utf8_chars != 0)
    {
        unsigned int c = 0;
        utf8_chars += ImTextCharFromUtf8(&c, utf8_chars, NULL);
        if (c != 0)
            InputQueueCharacters.push_back((ImWchar)c);
    }
}